

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O0

void process_flag(testing_base tb,int *pargn,int argc,char **argv,int flag,char *arg)

{
  int iVar1;
  char *arg_local;
  int flag_local;
  char **argv_local;
  int argc_local;
  int *pargn_local;
  testing_base tb_local;
  
  switch(flag) {
  case 0x42:
    tb->run_benchmarks = 1;
    tb->run_tests = 0;
    break;
  default:
    fprintf(_stderr,"%s: unrecognized flag \'%c\' in arg %d: \"%s\"\n",*argv,(ulong)(uint)flag,
            (ulong)(uint)*pargn,arg);
    exit(2);
  case 0x48:
    output_header(_stdout,"");
    exit(0);
  case 0x62:
    tb->run_benchmarks = 1;
    break;
  case 0x68:
    tb->suppress_header = 1;
    break;
  case 0x6c:
    tb->longshort = tb->longshort + 1;
    break;
  case 0x6d:
    if (*pargn + 1 == argc) {
      fprintf(_stderr,"%s: -m flag expects ,- or |-separated strings\n",*argv);
      exit(2);
    }
    iVar1 = *pargn;
    *pargn = iVar1 + 1;
    tb->include_pat = argv[iVar1 + 1];
    break;
  case 0x6e:
    if ((*pargn + 1 == argc) || (iVar1 = atoi(argv[*pargn + 1]), iVar1 < 1)) {
      fprintf(_stderr,"%s: -n flag expects parallelism value >= 1\n",*argv);
      exit(2);
    }
    iVar1 = *pargn;
    *pargn = iVar1 + 1;
    iVar1 = atoi(argv[iVar1 + 1]);
    tb->parallelism = iVar1;
    break;
  case 0x73:
    tb->longshort = tb->longshort + -1;
    break;
  case 0x76:
    tb->verbose = 1;
    break;
  case 0x78:
    if (*pargn + 1 == argc) {
      fprintf(_stderr,"%s: -x flag expects ,- or |-separated strings\n",*argv);
      exit(2);
    }
    iVar1 = *pargn;
    *pargn = iVar1 + 1;
    tb->exclude_pat = argv[iVar1 + 1];
  }
  return;
}

Assistant:

static void process_flag (testing_base tb, int *pargn, int argc, char *argv[], int flag,
			  const char *arg) {
	switch (flag) {
	case 'b':
		tb->run_benchmarks = 1;
		break;
	case 'B':
		tb->run_benchmarks = 1;
		tb->run_tests = 0;
		break;
	case 'H':
		output_header (stdout, "");
		exit (0);
	case 'h':
		tb->suppress_header = 1;
		break;
	case 'l':
		tb->longshort++;
		break;
	case 'm':
		if (*pargn + 1 == argc) {
			fprintf (stderr, "%s: -m flag expects ,- or |-separated strings\n",
				 argv[0]);
			exit (2);
		}
		tb->include_pat = argv[++*pargn];
		break;
	case 'n':
		if (*pargn + 1 == argc || atoi (argv[1 + *pargn]) < 1) {
			fprintf (stderr, "%s: -n flag expects parallelism value >= 1\n", argv[0]);
			exit (2);
		}
		tb->parallelism = atoi (argv[++*pargn]);
		break;
	case 's':
		tb->longshort--;
		break;
	case 'v':
		tb->verbose = 1;
		break;
	case 'x':
		if (*pargn + 1 == argc) {
			fprintf (stderr, "%s: -x flag expects ,- or |-separated strings\n",
				 argv[0]);
			exit (2);
		}
		tb->exclude_pat = argv[++*pargn];
		break;
	default:
		fprintf (stderr, "%s: unrecognized flag '%c' in arg %d: \"%s\"\n", argv[0], flag,
			 *pargn, arg);
		exit (2);
	}
}